

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void __thiscall TextFile::bufPut(TextFile *this,char c)

{
  char *pcVar1;
  char c_local;
  TextFile *this_local;
  
  if (this->mode == Write) {
    if (0xfff < this->bufPos) {
      bufDrainWrite(this);
    }
    this->bufPos = this->bufPos + 1;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->buf);
    *pcVar1 = c;
    return;
  }
  __assert_fail("mode == Write",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Util/FileClasses.cpp"
                ,0x3a3,"void TextFile::bufPut(const char)");
}

Assistant:

void TextFile::bufPut(const char c)
{
	assert(mode == Write);

	if (bufPos >= TEXTFILE_BUF_MAX_SIZE)
		bufDrainWrite();

	buf[bufPos++] = c;
}